

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O3

Type __thiscall de::FilePath::getType(FilePath *this)

{
  int iVar1;
  Type TVar2;
  FilePath normPath;
  stat st;
  FilePath local_b8;
  stat local_98;
  
  normalize(&local_b8,this);
  iVar1 = stat(local_b8.m_path._M_dataplus._M_p,&local_98);
  TVar2 = TYPE_UNKNOWN;
  if (iVar1 == 0) {
    TVar2 = TYPE_FILE;
    if ((local_98.st_mode & 0xf000) != 0x8000) {
      TVar2 = (uint)((local_98.st_mode & 0xf000) == 0x4000) * 2;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_path._M_dataplus._M_p != &local_b8.m_path.field_2) {
    operator_delete(local_b8.m_path._M_dataplus._M_p,
                    local_b8.m_path.field_2._M_allocated_capacity + 1);
  }
  return TVar2;
}

Assistant:

FilePath::Type FilePath::getType (void) const
{
	FilePath	normPath	= FilePath::normalize(*this);
	struct		stat		st;
	int			result		= stat(normPath.getPath(), &st);

	if (result != 0)
		return TYPE_UNKNOWN;

	int type = st.st_mode & S_IFMT;
	if (type == S_IFREG)
		return TYPE_FILE;
	else if (type == S_IFDIR)
		return TYPE_DIRECTORY;
	else
		return TYPE_UNKNOWN;
}